

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3gau_io.c
# Opt level: O2

int s3gau_read(char *fn,vector_t ****out,uint32 *out_n_mgau,uint32 *out_n_feat,uint32 *out_n_density
              ,uint32 **out_veclen)

{
  int iVar1;
  int32 iVar2;
  uint32 uVar3;
  FILE *fp;
  char *__s1;
  char *pcVar4;
  uint32 *buf;
  ulong uVar5;
  vector_t ***ppppfVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  undefined4 uVar10;
  undefined7 uVar11;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar12;
  uint32 n_feat;
  uint32 swap;
  uint32 chksum;
  uint32 n_density;
  uint32 n_mgau;
  undefined4 local_68;
  uint32 ignore;
  uint32 sv_chksum;
  uint32 n;
  uint32 *local_58;
  uint32 **local_50;
  uint32 *local_48;
  uint32 *local_40;
  float32 *raw;
  
  uVar12 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  chksum = 0;
  ignore = 0;
  local_48 = out_n_mgau;
  local_40 = out_n_feat;
  fp = s3open(fn,"rb",&swap);
  if (fp == (FILE *)0x0) {
    return -1;
  }
  local_58 = out_n_density;
  local_50 = out_veclen;
  __s1 = s3get_gvn_fattr("version");
  if (__s1 == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
            ,0x5b,"No version attribute for %s\n",fn);
  }
  else {
    iVar1 = strcmp(__s1,"1.0");
    if (iVar1 == 0) {
      pcVar4 = s3get_gvn_fattr("chksum0");
      uVar11 = (undefined7)((ulong)__s1 >> 8);
      if (pcVar4 == (char *)0x0) {
        uVar10 = (undefined4)CONCAT71(uVar11,1);
      }
      else if ((*pcVar4 == 'n') && (pcVar4[1] == 'o')) {
        uVar10 = (undefined4)CONCAT71(uVar11,pcVar4[2] == '\0');
      }
      else {
        uVar10 = 0;
      }
      iVar2 = bio_fread(&n_mgau,4,1,fp,swap,&chksum);
      if (((iVar2 == 1) && (iVar2 = bio_fread(&n_feat,4,1,fp,swap,&chksum), iVar2 == 1)) &&
         (iVar2 = bio_fread(&n_density,4,1,fp,swap,&chksum), iVar2 == 1)) {
        buf = (uint32 *)
              __ckd_calloc__((ulong)n_feat,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                             ,0x71);
        uVar3 = bio_fread(buf,4,n_feat,fp,swap,&chksum);
        if (uVar3 == n_feat) {
          iVar2 = bio_fread_1d(&raw,4,&n,fp,swap,&chksum);
          if (iVar2 < 0) {
            ckd_free(buf);
          }
          else {
            iVar1 = 0;
            for (uVar5 = 0; n_feat != uVar5; uVar5 = uVar5 + 1) {
              iVar1 = iVar1 + buf[uVar5];
            }
            uVar8 = iVar1 * n_mgau * n_density;
            if (n == uVar8) {
              local_68 = uVar10;
              ppppfVar6 = (vector_t ***)
                          __ckd_calloc_3d__((ulong)n_mgau,(ulong)n_feat,(ulong)n_density,8,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                                            ,0x86);
              uVar8 = 0;
              for (uVar5 = 0; uVar5 != n_mgau; uVar5 = uVar5 + 1) {
                for (uVar7 = 0; uVar7 != n_feat; uVar7 = uVar7 + 1) {
                  for (uVar9 = 0; n_density != uVar9; uVar9 = uVar9 + 1) {
                    ppppfVar6[uVar5][uVar7][uVar9] = (vector_t)(raw + uVar8);
                    uVar8 = uVar8 + buf[uVar7];
                  }
                }
              }
              if ((char)local_68 == '\0') {
                iVar2 = bio_fread(&sv_chksum,4,1,fp,swap,&ignore);
                if (iVar2 != 1) goto LAB_00105290;
                if (sv_chksum != chksum) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                          ,0x9b,"Checksum error; read corrupt data.\n");
                  goto LAB_00105395;
                }
              }
              *out = ppppfVar6;
              *local_48 = n_mgau;
              *local_40 = n_feat;
              *local_58 = n_density;
              *local_50 = buf;
              s3close(fp);
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                      ,0xa9,"Read %s [%ux%ux%u array]\n",fn,(ulong)n_mgau,CONCAT44(uVar12,n_feat),
                      n_density);
              return 0;
            }
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                    ,0x81,"Failed to read parameter file %s (expected %d values, got %d)\n",fn,
                    (ulong)uVar8,CONCAT44(uVar12,n));
          }
        }
      }
LAB_00105290:
      s3close(fp);
      return -1;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
            ,0x57,"Version mismatch for %s, file ver: %s != reader ver: %s\n",fn,__s1,"1.0");
  }
LAB_00105395:
  exit(1);
}

Assistant:

int
s3gau_read(const char *fn,
	   vector_t ****out,
	   uint32 *out_n_mgau,
	   uint32 *out_n_feat,
	   uint32 *out_n_density,
	   uint32 **out_veclen)
{
    FILE *fp;
    const char *do_chk;
    const char *ver;
    uint32 n_mgau, n_feat, n_density;
    uint32 *veclen;
    uint32 blk, i, j, k, r, n;
    uint32 chksum = 0;
    uint32 sv_chksum, ignore = 0;
    float32 *raw;
    vector_t ***o;
    uint32 swap;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, GAU_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, GAU_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    if (do_chk && !strcmp(do_chk, "no")) {
        do_chk = NULL;
    }
    
    if (bio_fread(&n_mgau, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    if (bio_fread(&n_feat, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    if (bio_fread(&n_density, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    veclen = ckd_calloc(n_feat, sizeof(uint32));
    if (bio_fread(veclen, sizeof(uint32), n_feat, fp, swap, &chksum) != n_feat) {
	goto error;
    }

    if (bio_fread_1d((void **)&raw, sizeof(float32), &n, fp, swap, &chksum) < 0) {
	ckd_free(veclen);

	goto error;
    }

    for (i = 0, blk = 0; i < n_feat; i++) {
	blk += veclen[i];
    }
    if (n != n_mgau * n_density * blk) {
	E_ERROR("Failed to read parameter file %s (expected %d values, got %d)\n",
		fn, n_mgau * n_density * blk, n);
	goto error;
    }

    o = (vector_t ***)ckd_calloc_3d(n_mgau, n_feat, n_density,
				    sizeof(vector_t));

    for (i = 0, r = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		o[i][j][k] = &raw[r];

		r += veclen[j];
	    }
	}
    }

    if (do_chk) {
	/* See if the checksum in the file matches that which
	   was computed from the read data */

	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
            goto error;
	}

	if (sv_chksum != chksum) {
	    E_FATAL("Checksum error; read corrupt data.\n");
	}
    }


    *out = o;
    *out_n_mgau = n_mgau;
    *out_n_feat = n_feat;
    *out_n_density = n_density;
    *out_veclen = veclen;

    s3close(fp);

    E_INFO("Read %s [%ux%ux%u array]\n",
	   fn, n_mgau, n_feat, n_density);

    return S3_SUCCESS;

error:
    if (fp) s3close(fp);

    return S3_ERROR;
}